

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O0

void __thiscall NoiseSource::~NoiseSource(NoiseSource *this)

{
  int local_18;
  int local_14;
  int i_1;
  int i;
  NoiseSource *this_local;
  
  (this->super_StochasticProcess).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__NoiseSource_00190298;
  (this->super_StochasticProcess).super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__NoiseSource_00190320;
  (this->super_StochasticProcess).super_Physical._vptr_Physical =
       (_func_int **)&PTR__NoiseSource_00190368;
  for (local_14 = 0; local_14 < this->nNoises; local_14 = local_14 + 1) {
    if ((this->aNoises[local_14] != (Noise *)0x0) && (this->aNoises[local_14] != (Noise *)0x0)) {
      (*(this->aNoises[local_14]->super_StochasticVariable).super_StochasticProcess.super_Parametric
        ._vptr_Parametric[1])();
    }
  }
  if (this->aNoises != (Noise **)0x0) {
    operator_delete__(this->aNoises);
  }
  for (local_18 = 0; local_18 < this->nNoises; local_18 = local_18 + 1) {
    if (this->aA[local_18] != (double *)0x0) {
      operator_delete__(this->aA[local_18]);
    }
  }
  if (this->aA != (double **)0x0) {
    operator_delete__(this->aA);
  }
  if (this->aOmega != (double *)0x0) {
    operator_delete__(this->aOmega);
  }
  RandN::~RandN((RandN *)this);
  StochasticProcess::~StochasticProcess(&this->super_StochasticProcess);
  return;
}

Assistant:

NoiseSource::~NoiseSource()
{
	// noises array
	for(int i=0; i<nNoises; ++i)
		if(aNoises[i])
			delete aNoises[i];
	delete[] aNoises;
	
	// mixing array
	for(int i=0; i<nNoises; i++)
		delete[] aA[i];
	delete[] aA;
	
	// omega array
	delete[] aOmega;
}